

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_brdf.h
# Opt level: O3

void __thiscall
djb::tab::tab(tab *this,vector<float,_std::allocator<float>_> *ndf,int zres,int pres)

{
  impl *piVar1;
  
  (this->super_microfacet).super_brdf._vptr_brdf = (_func_int **)&PTR_eval_001fdcd0;
  piVar1 = (impl *)operator_new(8);
  piVar1->_vptr_impl = (_func_int **)&PTR_clone_00207ae8;
  (this->super_microfacet).m_fresnel.m_f = piVar1;
  (this->super_microfacet).super_brdf._vptr_brdf = (_func_int **)&PTR_eval_001fddf0;
  std::vector<float,_std::allocator<float>_>::vector(&this->m_ndf,ndf);
  (this->m_cdf).super__Vector_base<djb::vec2,_std::allocator<djb::vec2>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_cdf).super__Vector_base<djb::vec2,_std::allocator<djb::vec2>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_cdf).super__Vector_base<djb::vec2,_std::allocator<djb::vec2>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->m_zres = zres;
  this->m_pres = pres;
  configure(this);
  return;
}

Assistant:

tab::tab(const std::vector<float_t> &ndf, int zres, int pres):
	microfacet(fresnel::ideal<1>()), m_ndf(ndf), m_zres(zres), m_pres(pres)
{
	configure();
}